

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_navigate_up(command *cmd)

{
  loc_conflict grid_00;
  _Bool _Var1;
  wchar_t wVar2;
  loc_conflict lVar3;
  square_conflict *psVar4;
  monster *mon_00;
  monster *mon;
  wchar_t m_idx;
  loc_conflict grid;
  wchar_t x;
  wchar_t y;
  wchar_t visible_monster_count;
  command *cmd_local;
  
  x = L'\0';
  if (player->timed[4] == 0) {
    lVar3.x = (player->grid).x;
    lVar3.y = (player->grid).y;
    _Var1 = square_iswebbed((chunk *)cave,lVar3);
    if (_Var1) {
      msg("You clear the web.");
      grid_00.x = (player->grid).x;
      grid_00.y = (player->grid).y;
      square_destroy_trap((chunk *)cave,grid_00);
      player->upkeep->energy_use = (uint)z_info->move_energy;
    }
    else {
      for (grid.y = L'\0'; grid.y < cave->height; grid.y = grid.y + L'\x01') {
        for (grid.x = L'\0'; grid.x < cave->width; grid.x = grid.x + L'\x01') {
          lVar3 = (loc_conflict)loc(grid.x,grid.y);
          _Var1 = loc_eq((loc)lVar3,player->grid);
          if ((!_Var1) && (_Var1 = square_isoccupied((chunk *)cave,lVar3), _Var1)) {
            psVar4 = square((chunk *)cave,lVar3);
            mon_00 = (monster *)cave_monster(cave,(int)psVar4->mon);
            _Var1 = monster_is_obvious(mon_00);
            if (_Var1) {
              x = x + L'\x01';
              break;
            }
          }
        }
      }
      if (x < L'\x01') {
        if (player->upkeep->steps != (int16_t *)0x0) {
          __assert_fail("!player->upkeep->steps",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                        ,0x5de,"void do_cmd_navigate_up(struct command *)");
        }
        wVar2 = path_nearest_known(player,player->grid,square_isupstairs,&player->upkeep->path_dest,
                                   &player->upkeep->steps);
        player->upkeep->step_count = wVar2;
        if (player->upkeep->step_count < L'\x01') {
          msg("No known path to upstairs.");
        }
        else {
          player->upkeep->running = player->upkeep->step_count;
          player->upkeep->update = player->upkeep->update | 2;
          run_step(L'\0');
        }
      }
      else {
        msg("Something is here.");
      }
    }
  }
  else {
    msg("You cannot explore while confused.");
  }
  return;
}

Assistant:

void do_cmd_navigate_up(struct command *cmd)
{
	int visible_monster_count = 0;
	/* cancel if confused */
	if (player->timed[TMD_CONFUSED]) {
		msg("You cannot explore while confused.");
	   	return;
	}


	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		msg("You clear the web.");
		square_destroy_trap(cave, player->grid);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}
	

	/* Screen for visible monsters */
	for (int y = 0; y < cave->height; y++) {
		for (int x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);

			if (loc_eq(grid, player->grid)) continue;

			if (square_isoccupied(cave, grid)) {
				int m_idx = square(cave, grid)->mon;
				struct monster *mon = cave_monster(cave, m_idx);
				if (monster_is_obvious(mon)) {
					visible_monster_count++;
					break;
				}
			}
		}
	}

	if (visible_monster_count > 0) {
		msg("Something is here.");
		return;
	}

	assert(!player->upkeep->steps);
	player->upkeep->step_count = path_nearest_known(player, player->grid,
		square_isupstairs, &player->upkeep->path_dest,
		&player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
		return;
	}

	msg("No known path to upstairs.");
}